

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Partition * __thiscall ASDCP::MXF::Partition::InitFromBuffer(Partition *this,byte_t *p,ui32_t l)

{
  bool bVar1;
  int iVar2;
  ILogSink *this_00;
  ui32_t in_ECX;
  undefined4 in_register_00000014;
  undefined1 local_38 [8];
  MemIOReader MemRDR;
  ui32_t l_local;
  byte_t *p_local;
  Partition *this_local;
  Result_t *result;
  
  Kumu::MemIOReader::MemIOReader
            ((MemIOReader *)local_38,(byte_t *)CONCAT44(in_register_00000014,l),in_ECX);
  Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
  bVar1 = Kumu::MemIOReader::ReadUi16BE((MemIOReader *)local_38,(ui16_t *)(p + 0x80));
  if (((((bVar1) &&
        (bVar1 = Kumu::MemIOReader::ReadUi16BE((MemIOReader *)local_38,(ui16_t *)(p + 0x82)), bVar1)
        ) && (bVar1 = Kumu::MemIOReader::ReadUi32BE((MemIOReader *)local_38,(ui32_t *)(p + 0x84)),
             bVar1)) &&
      (((bVar1 = Kumu::MemIOReader::ReadUi64BE((MemIOReader *)local_38,(ui64_t *)(p + 0x88)), bVar1
        && (bVar1 = Kumu::MemIOReader::ReadUi64BE((MemIOReader *)local_38,(ui64_t *)(p + 0x90)),
           bVar1)) &&
       ((bVar1 = Kumu::MemIOReader::ReadUi64BE((MemIOReader *)local_38,(ui64_t *)(p + 0x98)), bVar1
        && ((bVar1 = Kumu::MemIOReader::ReadUi64BE((MemIOReader *)local_38,(ui64_t *)(p + 0xa0)),
            bVar1 && (bVar1 = Kumu::MemIOReader::ReadUi64BE
                                        ((MemIOReader *)local_38,(ui64_t *)(p + 0xa8)), bVar1)))))))
      ) && ((bVar1 = Kumu::MemIOReader::ReadUi32BE((MemIOReader *)local_38,(ui32_t *)(p + 0xb0)),
            bVar1 && ((((bVar1 = Kumu::MemIOReader::ReadUi64BE
                                           ((MemIOReader *)local_38,(ui64_t *)(p + 0xb8)), bVar1 &&
                        (bVar1 = Kumu::MemIOReader::ReadUi32BE
                                           ((MemIOReader *)local_38,(ui32_t *)(p + 0xc0)), bVar1))
                       && (bVar1 = Kumu::Identifier<16U>::Unarchive
                                             ((Identifier<16U> *)(p + 200),(MemIOReader *)local_38),
                          bVar1)) &&
                      (bVar1 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::Unarchive
                                         ((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>
                                           *)(p + 0xe8),(MemIOReader *)local_38), bVar1)))))) {
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar2 < 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Failed to initialize Partition.\n");
  }
  Kumu::MemIOReader::~MemIOReader((MemIOReader *)local_38);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::InitFromBuffer(const byte_t* p, ui32_t l)
{
  Kumu::MemIOReader MemRDR(p, l);
  Result_t result = RESULT_KLV_CODING(__LINE__, __FILE__);

  if ( MemRDR.ReadUi16BE(&MajorVersion) )
    if ( MemRDR.ReadUi16BE(&MinorVersion) )
      if ( MemRDR.ReadUi32BE(&KAGSize) )
	if ( MemRDR.ReadUi64BE(&ThisPartition) )
	  if ( MemRDR.ReadUi64BE(&PreviousPartition) )
	    if ( MemRDR.ReadUi64BE(&FooterPartition) )
	      if ( MemRDR.ReadUi64BE(&HeaderByteCount) )
		if ( MemRDR.ReadUi64BE(&IndexByteCount) )
		  if ( MemRDR.ReadUi32BE(&IndexSID) )
		    if ( MemRDR.ReadUi64BE(&BodyOffset) )
		      if ( MemRDR.ReadUi32BE(&BodySID) )
			if ( OperationalPattern.Unarchive(&MemRDR) )
			  if ( EssenceContainers.Unarchive(&MemRDR) )
			    result = RESULT_OK;

  if ( ASDCP_FAILURE(result) )
    DefaultLogSink().Error("Failed to initialize Partition.\n");

  return result;
}